

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_gears.c
# Opt level: O2

void delete_gear(gears_t_conflict1 *gears,int id)

{
  gear_conflict *__ptr;
  
  __ptr = gears->gear[(uint)id];
  if (__ptr != (gear_conflict *)0x0) {
    if (__ptr->vbo != 0) {
      (*gears->glDeleteBuffers)(1,&__ptr->vbo);
    }
    free(__ptr->strips);
    free(__ptr->vertices);
    free(__ptr);
    gears->gear[(uint)id] = (gear_conflict *)0x0;
  }
  return;
}

Assistant:

static void delete_gear(gears_t *gears, int id)
{
  struct gear *gear = gears->gear[id];

  if (!gear) {
    return;
  }

  if (gear->list) {
    glDeleteLists(gear->list, 1);
  }

  free(gear);

  gears->gear[id] = NULL;
}